

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::RemoveDefineFlag(cmMakefile *this,char *flag,size_type len,string *dflags)

{
  int iVar1;
  ulong uVar2;
  
  strlen(flag);
  for (uVar2 = std::__cxx11::string::find((char *)dflags,(ulong)flag,0); uVar2 != 0xffffffffffffffff
      ; uVar2 = std::__cxx11::string::find((char *)dflags,(ulong)flag,uVar2)) {
    if (((uVar2 == 0) || (iVar1 = isspace((int)(dflags->_M_dataplus)._M_p[uVar2 - 1]), iVar1 != 0))
       && ((dflags->_M_string_length <= uVar2 + len ||
           (iVar1 = isspace((int)(dflags->_M_dataplus)._M_p[uVar2 + len]), iVar1 != 0)))) {
      std::__cxx11::string::erase((ulong)dflags,uVar2);
    }
    else {
      uVar2 = uVar2 + 1;
    }
    strlen(flag);
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefineFlag(const char* flag,
                                  std::string::size_type len,
                                  std::string& dflags)
{
  // Remove all instances of the flag that are surrounded by
  // whitespace or the beginning/end of the string.
  for(std::string::size_type lpos = dflags.find(flag, 0);
      lpos != std::string::npos; lpos = dflags.find(flag, lpos))
    {
    std::string::size_type rpos = lpos + len;
    if((lpos <= 0 || isspace(dflags[lpos-1])) &&
       (rpos >= dflags.size() || isspace(dflags[rpos])))
      {
      dflags.erase(lpos, len);
      }
    else
      {
      ++lpos;
      }
    }
}